

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

int __thiscall
trieste::detail::Inside<3UL>::clone
          (Inside<3UL> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 local_29;
  Inside<3UL> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (Inside<3UL> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::Inside<3ul>,std::allocator<trieste::detail::Inside<3ul>>,trieste::detail::Inside<3ul>const&>
            (a_Stack_20,&local_28,(allocator<trieste::detail::Inside<3UL>_> *)&local_29,
             (Inside<3UL> *)__fn);
  (this->super_PatternDef)._vptr_PatternDef = (_func_int **)local_28;
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)a_Stack_20[0]._M_pi;
  return (int)this;
}

Assistant:

PatternPtr clone() const& override
      {
        return std::make_shared<Inside>(*this);
      }